

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper.cpp
# Opt level: O2

void __thiscall cppcms::url_mapper::set_value(url_mapper *this,string *key,string *value)

{
  data *pdVar1;
  url_mapper *puVar2;
  mapped_type *pmVar3;
  undefined1 local_50 [48];
  
  puVar2 = root_mapper(this);
  pdVar1 = (puVar2->d).ptr_;
  string_key::string_key((string_key *)local_50,key);
  pmVar3 = std::
           map<cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&pdVar1->helpers,(string_key *)local_50);
  std::__cxx11::string::_M_assign((string *)pmVar3);
  std::__cxx11::string::~string((string *)(local_50 + 0x10));
  return;
}

Assistant:

void url_mapper::set_value(std::string const &key,std::string const &value)
	{
		root_mapper()->d->helpers[key]=value;
	}